

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O3

void __thiscall helics::CommonCore::broadcastToFederates(CommonCore *this,ActionMessage *cmd)

{
  uint uVar1;
  FedInfo **ppFVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  FedInfo **ppFVar6;
  FedInfo **ppFVar7;
  FedInfo *pFVar8;
  
  if ((this->loopFederates).dataStorage.csize == 0) {
    uVar1 = (this->loopFederates).dataStorage.bsize;
    ppFVar2 = (this->loopFederates).dataStorage.dataptr;
    if ((long)(int)uVar1 == 0x20) {
      lVar3 = (long)(this->loopFederates).dataStorage.dataSlotIndex;
      if (ppFVar2 == (FedInfo **)0x0) {
        ppFVar7 = (FedInfo **)
                  &gmlc::containers::
                   StableBlockVector<helics::FedInfo,5u,std::allocator<helics::FedInfo>>::end()::
                   emptyValue;
      }
      else {
        ppFVar7 = ppFVar2 + lVar3 + 1;
      }
      pFVar8 = *ppFVar7;
      uVar1 = 0;
      uVar4 = 0x20;
    }
    else {
      lVar3 = (long)(this->loopFederates).dataStorage.dataSlotIndex;
      ppFVar7 = ppFVar2 + lVar3;
      pFVar8 = *ppFVar7 + (int)uVar1;
      uVar4 = uVar1;
    }
  }
  else {
    ppFVar2 = (this->loopFederates).dataStorage.dataptr;
    pFVar8 = *ppFVar2;
    lVar3 = (long)(this->loopFederates).dataStorage.dataSlotIndex;
    uVar1 = 0;
    ppFVar7 = ppFVar2;
    uVar4 = (this->loopFederates).dataStorage.bsize;
  }
  if (ppFVar2 == (FedInfo **)0x0) {
    ppFVar6 = (FedInfo **)
              &gmlc::containers::
               StableBlockVector<helics::FedInfo,5u,std::allocator<helics::FedInfo>>::end()::
               emptyValue;
  }
  else {
    ppFVar6 = ppFVar2 + lVar3 + 1;
  }
  uVar5 = 0;
  if (uVar4 != 0x20) {
    ppFVar6 = ppFVar2 + lVar3;
    uVar5 = uVar4;
  }
  while ((uVar1 != uVar5 || (ppFVar7 != ppFVar6))) {
    if ((pFVar8->fed != (FederateState *)0x0) && (pFVar8->state == OPERATING)) {
      (cmd->dest_id).gid = (pFVar8->fed->global_id)._M_i.gid;
      FederateState::addAction(pFVar8->fed,cmd);
    }
    if ((int)uVar1 < 0x1f) {
      pFVar8 = pFVar8 + 1;
      uVar1 = uVar1 + 1;
    }
    else {
      ppFVar7 = ppFVar7 + (ulong)(uVar1 - 0x1f >> 5) + 1;
      uVar1 = uVar1 + 1 & 0x1f;
      pFVar8 = (FedInfo *)((long)&(*ppFVar7)->fed + (ulong)(uVar1 << 4));
    }
  }
  return;
}

Assistant:

void CommonCore::broadcastToFederates(ActionMessage& cmd)
{
    loopFederates.apply([&cmd](auto& fed) {
        if ((fed) && (fed.state == OperatingState::OPERATING)) {
            cmd.dest_id = fed->global_id;
            fed->addAction(cmd);
        }
    });
}